

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O2

void __thiscall QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance(iterator *this)

{
  long in_FS_OFFSET;
  next_result local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  next(&local_48,this->tokenizer,(this->current).state);
  *(undefined4 *)&(this->current).state.end = (undefined4)local_48.state.end;
  *(undefined4 *)((long)&(this->current).state.end + 4) = local_48.state.end._4_4_;
  *(undefined4 *)&(this->current).state.extra = (undefined4)local_48.state.extra;
  *(undefined4 *)((long)&(this->current).state.extra + 4) = local_48.state.extra._4_4_;
  (this->current).ok = local_48.ok;
  *(undefined3 *)&(this->current).field_0x11 = local_48._17_3_;
  *(undefined4 *)&(this->current).field_0x14 = local_48._20_4_;
  *(undefined4 *)&(this->current).state.start = (undefined4)local_48.state.start;
  *(undefined4 *)((long)&(this->current).state.start + 4) = local_48.state.start._4_4_;
  *(undefined4 *)&(this->current).value.m_size = (undefined4)local_48.value.m_size;
  *(undefined4 *)((long)&(this->current).value.m_size + 4) = local_48.value.m_size._4_4_;
  *(undefined4 *)&(this->current).value.m_data = local_48.value.m_data._0_4_;
  *(undefined4 *)((long)&(this->current).value.m_data + 4) = local_48.value.m_data._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void advance() {
            Q_ASSERT(current.ok);
            current = tokenizer->next(current.state);
        }